

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.h
# Opt level: O3

void __thiscall
slang::ast::DistExpression::visitExprs<slang::ast::DriverVisitor&>
          (DistExpression *this,DriverVisitor *visitor)

{
  size_t sVar1;
  pointer pDVar2;
  Expression *this_00;
  pointer pDVar3;
  Expression **ppEVar4;
  
  Expression::visitExpression<slang::ast::Expression_const,slang::ast::DriverVisitor&>
            (this->left_,this->left_,visitor);
  sVar1 = (this->items_)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    pDVar2 = (this->items_)._M_ptr;
    ppEVar4 = &(pDVar2->weight).
               super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
               super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
               _M_value.expr;
    do {
      Expression::visitExpression<slang::ast::Expression_const,slang::ast::DriverVisitor&>
                (ppEVar4[-2],ppEVar4[-2],visitor);
      if (*(char *)(ppEVar4 + 1) == '\x01') {
        Expression::visitExpression<slang::ast::Expression_const,slang::ast::DriverVisitor&>
                  (*ppEVar4,*ppEVar4,visitor);
      }
      pDVar3 = (pointer)(ppEVar4 + 2);
      ppEVar4 = ppEVar4 + 4;
    } while (pDVar3 != pDVar2 + sVar1);
  }
  if ((this->defaultWeight_).
      super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged != false) {
    this_00 = (this->defaultWeight_).
              super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
              _M_value.expr;
    Expression::visitExpression<slang::ast::Expression_const,slang::ast::DriverVisitor&>
              (this_00,this_00,visitor);
    return;
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        left().visit(visitor);
        for (auto& item : items_) {
            item.value.visit(visitor);
            if (item.weight)
                item.weight->expr->visit(visitor);
        }

        if (defaultWeight_)
            defaultWeight_->expr->visit(visitor);
    }